

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O0

Gia_Man_t * Abc_NtkFunctionalIsoGia(Abc_Ntk_t *pNtk,int iCo1,int iCo2,int fCommon)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Vec_Int_t *p;
  Vec_Int_t *p_00;
  Gia_Man_t *p_01;
  char *pcVar4;
  Vec_Int_t *vArr;
  Abc_Obj_t *pAVar5;
  Abc_Obj_t *pAVar6;
  Vec_Int_t *vCommon;
  int iLit2;
  int iLit1;
  int iCi;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vSupp2;
  Vec_Int_t *vSupp1;
  Gia_Man_t *pTemp;
  Gia_Man_t *pNew;
  int fCommon_local;
  int iCo2_local;
  int iCo1_local;
  Abc_Ntk_t *pNtk_local;
  
  pTemp = (Gia_Man_t *)0x0;
  p = Abc_NtkNodeSupportInt(pNtk,iCo1);
  p_00 = Abc_NtkNodeSupportInt(pNtk,iCo2);
  iVar1 = Vec_IntSize(p);
  iVar2 = Vec_IntSize(p_00);
  if (iVar1 == iVar2) {
    p_01 = Gia_ManStart(1000);
    pcVar4 = Abc_UtilStrsav(pNtk->pName);
    p_01->pName = pcVar4;
    pcVar4 = Abc_UtilStrsav(pNtk->pSpec);
    p_01->pSpec = pcVar4;
    Gia_ManHashStart(p_01);
    if (fCommon != 0) {
      iVar1 = Vec_IntSize(p);
      vArr = Vec_IntAlloc(iVar1);
      Vec_IntTwoRemoveCommon(p,p_00,vArr);
      Vec_IntAppend(p,vArr);
      Vec_IntAppend(p_00,vArr);
      Vec_IntFree(vArr);
      iVar1 = Vec_IntSize(p);
      iVar2 = Vec_IntSize(p_00);
      if (iVar1 != iVar2) {
        __assert_fail("Vec_IntSize(vSupp1) == Vec_IntSize(vSupp2)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcDfs.c"
                      ,0x3ec,"Gia_Man_t *Abc_NtkFunctionalIsoGia(Abc_Ntk_t *, int, int, int)");
      }
    }
    pAVar5 = Abc_AigConst1(pNtk);
    (pAVar5->field_6).iTemp = 1;
    for (iLit1 = 0; iVar1 = Vec_IntSize(p), iLit1 < iVar1; iLit1 = iLit1 + 1) {
      iVar1 = Vec_IntEntry(p,iLit1);
      iVar2 = Gia_ManAppendCi(p_01);
      pAVar5 = Abc_NtkCi(pNtk,iVar1);
      (pAVar5->field_6).iTemp = iVar2;
    }
    Abc_NtkIncrementTravId(pNtk);
    pAVar5 = Abc_NtkCo(pNtk,iCo1);
    pAVar6 = Abc_ObjFanin0(pAVar5);
    iVar1 = Abc_NtkFunctionalIsoGia_rec(p_01,pAVar6);
    iVar2 = Abc_ObjFaninC0(pAVar5);
    iVar1 = Abc_LitNotCond(iVar1,iVar2);
    for (iLit1 = 0; iVar2 = Vec_IntSize(p_00), iLit1 < iVar2; iLit1 = iLit1 + 1) {
      iVar2 = Vec_IntEntry(p_00,iLit1);
      iVar3 = Gia_ManCiLit(p_01,iLit1);
      pAVar5 = Abc_NtkCi(pNtk,iVar2);
      (pAVar5->field_6).iTemp = iVar3;
    }
    Abc_NtkIncrementTravId(pNtk);
    pAVar5 = Abc_NtkCo(pNtk,iCo2);
    pAVar6 = Abc_ObjFanin0(pAVar5);
    iVar2 = Abc_NtkFunctionalIsoGia_rec(p_01,pAVar6);
    iVar3 = Abc_ObjFaninC0(pAVar5);
    iVar2 = Abc_LitNotCond(iVar2,iVar3);
    Gia_ManAppendCo(p_01,iVar1);
    Gia_ManAppendCo(p_01,iVar2);
    pTemp = Gia_ManCleanup(p_01);
    Gia_ManStop(p_01);
  }
  Vec_IntFree(p);
  Vec_IntFree(p_00);
  return pTemp;
}

Assistant:

Gia_Man_t * Abc_NtkFunctionalIsoGia( Abc_Ntk_t * pNtk, int iCo1, int iCo2, int fCommon )
{
    Gia_Man_t * pNew = NULL, * pTemp;
    Vec_Int_t * vSupp1 = Abc_NtkNodeSupportInt( pNtk, iCo1 );
    Vec_Int_t * vSupp2 = Abc_NtkNodeSupportInt( pNtk, iCo2 );
    if ( Vec_IntSize(vSupp1) == Vec_IntSize(vSupp2) )
    {
        Abc_Obj_t * pObj;
        int i, iCi, iLit1, iLit2;
        pNew = Gia_ManStart( 1000 );
        pNew->pName = Abc_UtilStrsav( pNtk->pName );
        pNew->pSpec = Abc_UtilStrsav( pNtk->pSpec );
        Gia_ManHashStart( pNew );
        // put commom together
        if ( fCommon )
        {
            Vec_Int_t * vCommon = Vec_IntAlloc( Vec_IntSize(vSupp1) );
            Vec_IntTwoRemoveCommon( vSupp1, vSupp2, vCommon );
            Vec_IntAppend( vSupp1, vCommon );
            Vec_IntAppend( vSupp2, vCommon );
            Vec_IntFree( vCommon );
            assert( Vec_IntSize(vSupp1) == Vec_IntSize(vSupp2) );            
        }
        // primary inputs
        Abc_AigConst1(pNtk)->iTemp = 1;
        Vec_IntForEachEntry( vSupp1, iCi, i )
            Abc_NtkCi(pNtk, iCi)->iTemp = Gia_ManAppendCi(pNew);
        // create the first cone
        Abc_NtkIncrementTravId( pNtk );
        pObj = Abc_NtkCo( pNtk, iCo1 );
        iLit1 = Abc_NtkFunctionalIsoGia_rec( pNew, Abc_ObjFanin0(pObj) );
        iLit1 = Abc_LitNotCond( iLit1, Abc_ObjFaninC0(pObj) );
        // primary inputs
        Vec_IntForEachEntry( vSupp2, iCi, i )
            Abc_NtkCi(pNtk, iCi)->iTemp = Gia_ManCiLit(pNew, i);
        // create the second cone
        Abc_NtkIncrementTravId( pNtk );
        pObj = Abc_NtkCo( pNtk, iCo2 );
        iLit2 = Abc_NtkFunctionalIsoGia_rec( pNew, Abc_ObjFanin0(pObj) );
        iLit2 = Abc_LitNotCond( iLit2, Abc_ObjFaninC0(pObj) );
        Gia_ManAppendCo( pNew, iLit1 );
        Gia_ManAppendCo( pNew, iLit2 );
        // perform cleanup
        pNew = Gia_ManCleanup( pTemp = pNew );
        Gia_ManStop( pTemp );
    }
    Vec_IntFree( vSupp1 );
    Vec_IntFree( vSupp2 );
    return pNew;
}